

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

Xt __thiscall cppforth::Forth::findDefinition(Forth *this,CAddr nameToFind,Cell nameLength)

{
  Xt XVar1;
  string Word1;
  
  if (nameLength == 0) {
    XVar1 = 0;
  }
  else {
    Word1._M_dataplus._M_p = (pointer)&Word1.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&Word1,(ulong)nameLength,' ');
    moveFromDataSpace(this,&Word1,nameToFind,(ulong)nameLength);
    XVar1 = findDefinition(this,&Word1);
    std::__cxx11::string::~string((string *)&Word1);
  }
  return XVar1;
}

Assistant:

Xt findDefinition(CAddr nameToFind, Cell nameLength) {
			if (nameLength == 0)
				return 0;
			std::string Word1(nameLength,' ');
			moveFromDataSpace(Word1, nameToFind, nameLength);
			return findDefinition(Word1);
			/* for (auto & c: Word1) c = toupper_ascii(static_cast<unsigned char>(c));
			for (auto i = definitions.rbegin(), iend=definitions.rend(); i != iend ; ++i) {
				auto& defn = *i;
				//if (!defn.isFindable())
				if (defn.isHidden())
					continue;
				auto& name = defn.name;
				if(nameLength==name.length() && Word1.compare(name)==0) {
					return defn.numberInVector; 
				}
			}
			return 0; */
		}